

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

int NULLCFile::FileWriteType<short>(short data,File *file)

{
  size_t sVar1;
  char *error;
  short data_local;
  
  data_local = data;
  if (file == (File *)0x0) {
    error = "ERROR: null pointer access";
  }
  else {
    if ((FILE *)file->handle != (FILE *)0x0) {
      sVar1 = fwrite(&data_local,2,1,(FILE *)file->handle);
      return (uint)(sVar1 == 1);
    }
    error = "Cannot write to a closed file.";
  }
  nullcThrowError(error);
  return 0;
}

Assistant:

int FileWriteType(T data, File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return 0;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot write to a closed file.");
			return 0;
		}

		return 1 == fwrite(&data, sizeof(T), 1, file->handle);
	}